

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

bool __thiscall trun::Process_Unix::CreatePipe(Process_Unix *this,int *filedes)

{
  int iVar1;
  ILogger *this_00;
  char *arguments_2;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = pipe(filedes);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Process_Unix",&local_39)
    ;
    this_00 = gnilk::Logger::GetLogger(&local_38);
    arguments_2 = strerror(-1);
    gnilk::Log::Error<char_const*,int,char*>(this_00,"stdout pipe %d, %s",-1,arguments_2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return iVar1 != -1;
}

Assistant:

bool Process_Unix::CreatePipe(int *filedes) {
	int status = pipe(filedes);
	if (status == -1) {
        gnilk::Logger::GetLogger("Process_Unix")->Error("stdout pipe %d, %s", status, strerror(status));
		return false;
	}
	return true;
}